

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::image::anon_unknown_0::SizeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SizeTestInstance *this)

{
  ProgramCollection<vk::ProgramBinary> *this_00;
  long lVar1;
  bool bVar2;
  deUint32 queueFamilyIndex;
  int iVar3;
  DeviceInterface *deviceInterface;
  VkDevice device;
  VkQueue queue;
  ProgramBinary *binary;
  VkDescriptorSetLayout descriptorSetLayout;
  undefined4 extraout_var_00;
  Vector<int,_3> *value;
  Vector<int,_3> *value_00;
  TestStatus *__return_storage_ptr___00;
  string *this_01;
  Vector<int,_3> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_1b8;
  TestStatus *local_190;
  string local_188;
  Vector<int,_3> local_168;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_158;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_138;
  VkDescriptorSet descriptorSet;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  VkBufferMemoryBarrier shaderWriteBarrier;
  undefined4 extraout_var;
  
  local_190 = __return_storage_ptr__;
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  makeBufferMemoryBarrier
            (&shaderWriteBarrier,0x40,0x2000,
             (VkBuffer)
             (((this->m_resultBuffer).
               super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.
              ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
             ,0,this->m_resultBufferSizeBytes);
  this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"comp",(allocator<char> *)&local_158);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_188);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_138,deviceInterface,device,binary,0);
  local_108.m_data.deleter.m_device = local_138.m_data.deleter.m_device;
  local_108.m_data.deleter.m_allocator = local_138.m_data.deleter.m_allocator;
  local_108.m_data.object.m_internal = local_138.m_data.object.m_internal;
  local_108.m_data.deleter.m_deviceIface = local_138.m_data.deleter.m_deviceIface;
  local_138.m_data.object.m_internal = 0;
  local_138.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_138.m_data.deleter.m_device = (VkDevice)0x0;
  local_138.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_138);
  std::__cxx11::string::~string((string *)&local_188);
  descriptorSetLayout.m_internal._0_4_ = (*(this->super_TestInstance)._vptr_TestInstance[3])(this);
  descriptorSetLayout.m_internal._4_4_ = extraout_var;
  iVar3 = (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  descriptorSet.m_internal = CONCAT44(extraout_var_00,iVar3);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&local_188,deviceInterface,device,
                     descriptorSetLayout);
  local_138.m_data.deleter.m_device = (VkDevice)local_188.field_2._M_allocated_capacity;
  local_138.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_188.field_2._8_8_;
  local_138.m_data.object.m_internal = (deUint64)local_188._M_dataplus._M_p;
  local_138.m_data.deleter.m_deviceIface = (DeviceInterface *)local_188._M_string_length;
  local_188._M_dataplus._M_p = (pointer)0x0;
  local_188._M_string_length = 0;
  local_188.field_2._M_allocated_capacity = 0;
  local_188.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_188);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&local_158,deviceInterface,device,
                      (VkPipelineLayout)local_138.m_data.object.m_internal,
                      (VkShaderModule)local_108.m_data.object.m_internal);
  local_188.field_2._M_allocated_capacity = (size_type)local_158.m_data.deleter.m_device;
  local_188.field_2._8_8_ = local_158.m_data.deleter.m_allocator;
  local_188._M_dataplus._M_p = (pointer)local_158.m_data.object.m_internal;
  local_188._M_string_length = (size_type)local_158.m_data.deleter.m_deviceIface;
  local_158.m_data.object.m_internal = 0;
  local_158.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_158.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_158);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_1b8,deviceInterface,device,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_158.m_data.deleter.m_device = local_1b8.m_data.deleter.m_device;
  local_158.m_data.deleter.m_allocator = local_1b8.m_data.deleter.m_allocator;
  local_158.m_data.object.m_internal = local_1b8.m_data.object.m_internal;
  local_158.m_data.deleter.m_deviceIface = local_1b8.m_data.deleter.m_deviceIface;
  local_1b8.m_data.object.m_internal = 0;
  local_1b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_1b8);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_1d8,deviceInterface,device,
             (VkCommandPool)local_158.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_1b8.m_data.deleter.m_device = (VkDevice)local_1d8.field_2._M_allocated_capacity;
  local_1b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1d8.field_2._8_8_;
  local_1b8.m_data.object.m_internal = (deUint64)local_1d8._M_dataplus._M_p;
  local_1b8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_1d8._M_string_length;
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1d8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_1d8);
  beginCommandBuffer(deviceInterface,(VkCommandBuffer)local_1b8.m_data.object.m_internal);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])
            (deviceInterface,local_1b8.m_data.object.m_internal,1,local_188._M_dataplus._M_p);
  (*deviceInterface->_vptr_DeviceInterface[0x56])
            (deviceInterface,local_1b8.m_data.object.m_internal,1,local_138.m_data.object.m_internal
             ,0,1,&descriptorSet,0,0);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,local_1b8.m_data.object.m_internal);
  (*deviceInterface->_vptr_DeviceInterface[0x5d])
            (deviceInterface,local_1b8.m_data.object.m_internal,1,1,1);
  (*deviceInterface->_vptr_DeviceInterface[0x6d])
            (deviceInterface,local_1b8.m_data.object.m_internal,0x800,0x4000,0,0,0,1,
             &shaderWriteBarrier,0,0);
  endCommandBuffer(deviceInterface,(VkCommandBuffer)local_1b8.m_data.object.m_internal);
  submitCommandsAndWait
            (deviceInterface,device,queue,(VkCommandBuffer)local_1b8.m_data.object.m_internal);
  lVar1 = (long)(((this->m_resultBuffer).
                  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                  m_data.ptr)->m_allocation).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (deviceInterface,device,(VkDeviceMemory)*(deUint64 *)(lVar1 + 8),
             *(VkDeviceSize *)(lVar1 + 0x10),this->m_resultBufferSizeBytes);
  local_168.m_data[2] = (*(int **)(lVar1 + 0x18))[2];
  local_168.m_data._0_8_ = *(undefined8 *)*(int **)(lVar1 + 0x18);
  Texture::size((Texture *)&local_1d8);
  iVar3 = local_1e8.m_data[1];
  local_1e8.m_data[1] = (int)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
  switch((this->m_texture).m_type) {
  case IMAGE_TYPE_1D:
  case IMAGE_TYPE_BUFFER:
    local_1e8.m_data[0] = (int)local_1d8._M_dataplus._M_p;
    local_1e8.m_data[1] = 0;
    local_1e8.m_data[2] = 0;
    break;
  case IMAGE_TYPE_1D_ARRAY:
  case IMAGE_TYPE_2D:
  case IMAGE_TYPE_CUBE:
    local_1e8.m_data[2] = 0;
    local_1e8.m_data[0] = (int)local_1d8._M_dataplus._M_p;
    break;
  case IMAGE_TYPE_2D_ARRAY:
  case IMAGE_TYPE_3D:
    local_1e8.m_data[1] = iVar3;
    tcu::Vector<int,_3>::Vector(&local_1e8,(Vector<int,_3> *)&local_1d8);
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    local_1e8.m_data[2] = (int)local_1d8._M_string_length / 6;
    local_1e8.m_data[0] = (int)local_1d8._M_dataplus._M_p;
    break;
  default:
    local_1e8.m_data[1] = iVar3;
    tcu::Vector<int,_3>::Vector(&local_1e8);
  }
  bVar2 = tcu::Vector<int,_3>::operator!=(&local_168,&local_1e8);
  if (bVar2) {
    de::toString<tcu::Vector<int,3>>(&local_a8,(de *)&local_1e8,value);
    __return_storage_ptr___00 = local_190;
    std::operator+(&local_88,"Incorrect imageSize(): expected ",&local_a8);
    std::operator+(&local_e8,&local_88," but got ");
    de::toString<tcu::Vector<int,3>>(&local_c8,(de *)&local_168,value_00);
    std::operator+(&local_1d8,&local_e8,&local_c8);
    tcu::TestStatus::fail(__return_storage_ptr___00,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_88);
    this_01 = &local_a8;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"Passed",(allocator<char> *)&local_e8);
    __return_storage_ptr___00 = local_190;
    tcu::TestStatus::pass(local_190,&local_1d8);
    this_01 = &local_1d8;
  }
  std::__cxx11::string::~string((string *)this_01);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_1b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_158);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_188);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_138);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_108);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus SizeTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	// Create memory barriers.

	const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT,
		m_resultBuffer->get(), 0ull, m_resultBufferSizeBytes);

	// Create the pipeline.

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0));

	const VkDescriptorSetLayout descriptorSetLayout = prepareDescriptors();
	const VkDescriptorSet descriptorSet = getDescriptorSet();

	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const Unique<VkCommandPool> cmdPool(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

	commandBeforeCompute(*cmdBuffer);
	vk.cmdDispatch(*cmdBuffer, 1, 1, 1);
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &shaderWriteBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Compare the result.

	const Allocation& bufferAlloc = m_resultBuffer->getAllocation();
	invalidateMappedMemoryRange(vk, device, bufferAlloc.getMemory(), bufferAlloc.getOffset(), m_resultBufferSizeBytes);

	const tcu::IVec3 resultSize = readIVec3(bufferAlloc.getHostPtr());
	const tcu::IVec3 expectedSize = getExpectedImageSizeResult(m_texture);

	if (resultSize != expectedSize)
		return tcu::TestStatus::fail("Incorrect imageSize(): expected " + de::toString(expectedSize) + " but got " + de::toString(resultSize));
	else
		return tcu::TestStatus::pass("Passed");
}